

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_decode(caption_frame_t *frame,uint16_t cc_data,double timestamp)

{
  int iVar1;
  libcaption_stauts_t lVar2;
  uint16_t in_SI;
  caption_frame_t *in_RDI;
  caption_frame_t *in_XMM0_Qa;
  undefined6 in_stack_ffffffffffffffd8;
  uint16_t in_stack_ffffffffffffffde;
  undefined6 in_stack_ffffffffffffffe8;
  libcaption_stauts_t local_4;
  
  iVar1 = eia608_parity_varify(0);
  if (iVar1 == 0) {
    in_RDI->status = LIBCAPTION_ERROR;
    return in_RDI->status;
  }
  iVar1 = eia608_is_padding(in_SI);
  if (iVar1 != 0) {
    in_RDI->status = LIBCAPTION_OK;
    return in_RDI->status;
  }
  if (0.0 < in_RDI->timestamp || in_RDI->timestamp == 0.0) {
    if (((in_RDI->timestamp != (double)in_XMM0_Qa) ||
        (NAN(in_RDI->timestamp) || NAN((double)in_XMM0_Qa))) && (in_RDI->status != LIBCAPTION_READY)
       ) goto LAB_0011783e;
  }
  in_RDI->timestamp = (double)in_XMM0_Qa;
  in_RDI->status = LIBCAPTION_OK;
LAB_0011783e:
  iVar1 = eia608_is_specialna(in_SI);
  if (((iVar1 == 0) && (iVar1 = eia608_is_control(in_SI), iVar1 == 0)) ||
     (in_SI != (in_RDI->state).cc_data)) {
    (in_RDI->state).cc_data = in_SI;
    if ((in_RDI->xds).state == 0) {
      iVar1 = eia608_is_xds(in_SI);
      if (iVar1 == 0) {
        iVar1 = eia608_is_control(in_SI);
        if (iVar1 == 0) {
          iVar1 = eia608_is_basicna(in_SI);
          if (((iVar1 == 0) && (iVar1 = eia608_is_specialna(in_SI), iVar1 == 0)) &&
             (iVar1 = eia608_is_westeu(in_SI), iVar1 == 0)) {
            iVar1 = eia608_is_preamble(in_SI);
            if (iVar1 == 0) {
              iVar1 = eia608_is_midrowchange(in_SI);
              if (iVar1 != 0) {
                lVar2 = caption_frame_decode_midrowchange(in_XMM0_Qa,in_stack_ffffffffffffffde);
                in_RDI->status = lVar2;
              }
            }
            else {
              lVar2 = caption_frame_decode_preamble(in_RDI,in_SI);
              in_RDI->status = lVar2;
            }
          }
          else {
            if (in_RDI->write == (caption_frame_buffer_t *)0x0) {
              in_RDI->status = LIBCAPTION_OK;
              return in_RDI->status;
            }
            lVar2 = caption_frame_decode_text(in_RDI,in_SI);
            in_RDI->status = lVar2;
            if ((in_RDI->status == LIBCAPTION_OK) &&
               (iVar1 = caption_frame_painton(in_RDI), iVar1 != 0)) {
              in_RDI->status = LIBCAPTION_READY;
            }
          }
        }
        else {
          lVar2 = caption_frame_decode_control
                            ((caption_frame_t *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),
                             (uint16_t)((ulong)in_XMM0_Qa >> 0x30));
          in_RDI->status = lVar2;
        }
      }
      else {
        lVar2 = xds_decode((xds_t *)CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),0)
        ;
        in_RDI->status = lVar2;
      }
    }
    else {
      lVar2 = xds_decode((xds_t *)CONCAT26(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8),0);
      in_RDI->status = lVar2;
    }
    local_4 = in_RDI->status;
  }
  else {
    in_RDI->status = LIBCAPTION_OK;
    local_4 = in_RDI->status;
  }
  return local_4;
}

Assistant:

libcaption_stauts_t caption_frame_decode(caption_frame_t* frame, uint16_t cc_data, double timestamp)
{
    if (!eia608_parity_varify(cc_data)) {
        frame->status = LIBCAPTION_ERROR;
        return frame->status;
    }

    if (eia608_is_padding(cc_data)) {
        frame->status = LIBCAPTION_OK;
        return frame->status;
    }

    if (0 > frame->timestamp || frame->timestamp == timestamp || LIBCAPTION_READY == frame->status) {
        frame->timestamp = timestamp;
        frame->status = LIBCAPTION_OK;
    }

    // skip duplicate controll commands. We also skip duplicate specialna to match the behaviour of iOS/vlc
    if ((eia608_is_specialna(cc_data) || eia608_is_control(cc_data)) && cc_data == frame->state.cc_data) {
        frame->status = LIBCAPTION_OK;
        return frame->status;
    }

    frame->state.cc_data = cc_data;

    if (frame->xds.state) {
        frame->status = xds_decode(&frame->xds, cc_data);
    } else if (eia608_is_xds(cc_data)) {
        frame->status = xds_decode(&frame->xds, cc_data);
    } else if (eia608_is_control(cc_data)) {
        frame->status = caption_frame_decode_control(frame, cc_data);
    } else if (eia608_is_basicna(cc_data) || eia608_is_specialna(cc_data) || eia608_is_westeu(cc_data)) {

        // Don't decode text if we dont know what mode we are in.
        if (!frame->write) {
            frame->status = LIBCAPTION_OK;
            return frame->status;
        }

        frame->status = caption_frame_decode_text(frame, cc_data);

        // If we are in paint on mode, display immiditally
        if (LIBCAPTION_OK == frame->status && caption_frame_painton(frame)) {
            frame->status = LIBCAPTION_READY;
        }
    } else if (eia608_is_preamble(cc_data)) {
        frame->status = caption_frame_decode_preamble(frame, cc_data);
    } else if (eia608_is_midrowchange(cc_data)) {
        frame->status = caption_frame_decode_midrowchange(frame, cc_data);
    }

    return frame->status;
}